

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O2

pair<bool,_mp::sol::Status> __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProcessMOIterationPostsolvedSolution
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  bool bVar1;
  Status SVar2;
  Solution SStack_88;
  
  SVar2 = std::function<mp::sol::Status_()>::operator()(get_stt);
  bVar1 = 99 < (uint)(SVar2 + ~INFEASIBLE_LAST) &&
          (0xffffffcd < (uint)(SVar2 + ~LIMIT_FEAS_LAST) || (uint)SVar2 < 100);
  if (bVar1) {
    std::function<mp::Solution_()>::operator()(&SStack_88,get_sol);
    Solution::~Solution(&SStack_88);
  }
  else {
    this->status_ = FINISHED;
  }
  return (pair<bool,_mp::sol::Status>)((ulong)(uint)SVar2 << 0x20 | (ulong)bVar1);
}

Assistant:

std::pair<bool, sol::Status> ProcessMOIterationPostsolvedSolution(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    auto solst = get_stt();
    assert(sol::Status::NOT_SET != solst);
    assert(IsMOActive());
    assert(MOManagerStatus::FINISHED != status_);
    if ((sol::IsProblemSolvedOrFeasible((sol::Status)solst)
        // || sol::IsProblemMaybeSolved(solst)    // Use this?
         )  && !sol::IsProblemUnbounded((sol::Status)solst)  // Don't want unbounded
        ) {                                                  // (but LIMIT can have this undiscovered)
      get_sol();    // This implicitly calls ProcessMOIterationUnpostsolvedSolution().
      return { true, solst };
      // We ignore the solution here - but having it provided
      // guarantees that the postsolve has been run.
    }
    status_ = MOManagerStatus::FINISHED;
    return { false, solst };
  }